

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O3

void __thiscall
TTD::SnapshotExtractor::ExtractHandlerIfNeeded
          (SnapshotExtractor *this,DynamicTypeHandler *handler,ThreadContext *threadContext)

{
  int32 iVar1;
  SnapHandler *handler_00;
  SlabAllocator *alloc;
  SnapHandler *local_38;
  SnapHandler *sHandler;
  
  iVar1 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)handler);
  if ((this->m_marks).m_markArray[iVar1] != Clear) {
    handler_00 = SnapShot::GetNextAvailableHandlerEntry(this->m_pendingSnap);
    local_38 = handler_00;
    alloc = SnapShot::GetSnapshotSlabAllocator(this->m_pendingSnap);
    Js::DynamicTypeHandler::ExtractSnapHandler(handler,handler_00,threadContext,alloc);
    TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::AddItem
              (&this->m_idToHandlerMap,handler_00->HandlerId,&local_38);
    iVar1 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)handler);
    (this->m_marks).m_markArray[iVar1] = Clear;
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractHandlerIfNeeded(Js::DynamicTypeHandler* handler, ThreadContext* threadContext)
    {
        if(this->m_marks.IsMarked(handler))
        {
            NSSnapType::SnapHandler* sHandler = this->m_pendingSnap->GetNextAvailableHandlerEntry();
            handler->ExtractSnapHandler(sHandler, threadContext, this->m_pendingSnap->GetSnapshotSlabAllocator());

            this->m_idToHandlerMap.AddItem(sHandler->HandlerId, sHandler);
            this->m_marks.ClearMark(handler);
        }
    }